

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O3

bool tinyusdz::linear_sRGB_to_linear_displayp3
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,vector<float,_std::allocator<float>_> *out_img,string *err)

{
  ostringstream *poVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  string *psVar4;
  ostream *poVar5;
  long lVar6;
  pointer pfVar7;
  pointer pfVar8;
  pointer pcVar9;
  pointer __new_size;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  ostringstream ss_e;
  string local_208;
  string *local_1e8;
  string local_1e0;
  size_t local_1c0;
  unsigned_long local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1c0 = channels;
  if (width == 0) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    ::std::__cxx11::ostringstream::ostringstream(poVar1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
               ,0x54);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"linear_sRGB_to_linear_displayp3",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<(poVar1,0x2ef);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar10 = "width is zero.";
    lVar6 = 0xe;
LAB_0044de32:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),pcVar10,lVar6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"\n",1);
    if (err == (string *)0x0) goto LAB_0044de8c;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_0044de8c;
  }
  else {
    if (height == 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"linear_sRGB_to_linear_displayp3",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(poVar1,0x2f3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar10 = "height is zero.";
      lVar6 = 0xf;
      goto LAB_0044de32;
    }
    if (channels == 0) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"linear_sRGB_to_linear_displayp3",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(poVar1,0x2f7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar10 = "channels is zero.";
      lVar6 = 0x11;
      goto LAB_0044de32;
    }
    if (channels - 5 < 0xfffffffffffffffe) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"linear_sRGB_to_linear_displayp3",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(poVar1,0x2fb);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"channels must be 3 or 4, but got {}","");
      fmt::format<unsigned_long>(&local_208,&local_1e0,&local_1c0);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_208._M_dataplus._M_p,local_208._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (err == (string *)0x0) goto LAB_0044de8c;
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_0044de8c;
    }
    else {
      if (out_img == (vector<float,_std::allocator<float>_> *)0x0) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        ::std::__cxx11::ostringstream::ostringstream(poVar1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                   ,0x54);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"linear_sRGB_to_linear_displayp3",0x1f);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<(poVar1,0x2ff);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar10 = "`out_img` is nullptr.";
        lVar6 = 0x15;
        goto LAB_0044de32;
      }
      __new_size = (pointer)((long)(in_img->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(in_img->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
      pcVar9 = (pointer)(height * width * channels);
      local_1e8 = err;
      if (__new_size == pcVar9) {
        ::std::vector<float,_std::allocator<float>_>::resize(out_img,(size_type)__new_size);
        pfVar7 = (in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar8 = (out_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (channels == 3) {
          pfVar8 = pfVar8 + 2;
          pfVar7 = pfVar7 + 2;
          sVar11 = 0;
          do {
            lVar6 = 0;
            sVar12 = width;
            do {
              uVar3 = *(undefined8 *)((long)pfVar7 + lVar6 + -8);
              fVar13 = (float)uVar3;
              fVar15 = (float)((ulong)uVar3 >> 0x20);
              auVar16._0_4_ = fVar13 * 0.8225 + fVar15 * 0.1774;
              auVar16._4_4_ = fVar15 * 0.9669 + fVar13 * 0.0332;
              auVar16._8_8_ = 0;
              auVar14 = maxps(ZEXT816(0),auVar16);
              fVar15 = fVar15 * 0.0724 + fVar13 * 0.0171 + *(float *)((long)pfVar7 + lVar6) * 0.9108
              ;
              fVar13 = 0.0;
              if (0.0 <= fVar15) {
                fVar13 = fVar15;
              }
              *(long *)((long)pfVar8 + lVar6 + -8) = auVar14._0_8_;
              *(float *)((long)pfVar8 + lVar6) = fVar13;
              lVar6 = lVar6 + 0xc;
              sVar12 = sVar12 - 1;
            } while (sVar12 != 0);
            sVar11 = sVar11 + 1;
            pfVar8 = pfVar8 + width * 3;
            pfVar7 = pfVar7 + width * 3;
          } while (sVar11 != height);
          return true;
        }
        pfVar8 = pfVar8 + 3;
        pfVar7 = pfVar7 + 3;
        sVar11 = 0;
        do {
          lVar6 = 0;
          sVar12 = width;
          do {
            uVar2 = *(undefined4 *)((long)pfVar7 + lVar6);
            uVar3 = *(undefined8 *)((long)pfVar7 + lVar6 + -0xc);
            fVar13 = (float)uVar3;
            fVar15 = (float)((ulong)uVar3 >> 0x20);
            auVar14._4_4_ = fVar15 * 0.9669 + fVar13 * 0.0332;
            auVar14._0_4_ = fVar13 * 0.8225 + fVar15 * 0.1774;
            auVar14._8_8_ = 0;
            auVar14 = maxps(ZEXT816(0),auVar14);
            fVar15 = fVar15 * 0.0724 + fVar13 * 0.0171 +
                     *(float *)((long)pfVar7 + lVar6 + -4) * 0.9108;
            fVar13 = 0.0;
            if (0.0 <= fVar15) {
              fVar13 = fVar15;
            }
            *(long *)((long)pfVar8 + lVar6 + -0xc) = auVar14._0_8_;
            *(float *)((long)pfVar8 + lVar6 + -4) = fVar13;
            *(undefined4 *)((long)pfVar8 + lVar6) = uVar2;
            lVar6 = lVar6 + 0x10;
            sVar12 = sVar12 - 1;
          } while (sVar12 != 0);
          sVar11 = sVar11 + 1;
          pfVar8 = pfVar8 + width * 4;
          pfVar7 = pfVar7 + width * 4;
        } while (sVar11 != height);
        return true;
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      ::std::__cxx11::ostringstream::ostringstream(poVar1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                 ,0x54);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"linear_sRGB_to_linear_displayp3",0x1f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(poVar1,0x304);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"Input buffer size must be {}, but got {}","");
      local_1b8 = (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(in_img->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2;
      local_1b0._0_8_ = pcVar9;
      fmt::format<unsigned_long,unsigned_long>
                (&local_208,(fmt *)&local_1e0,(string *)local_1b0,&local_1b8,
                 (unsigned_long *)out_img);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_208._M_dataplus._M_p,local_208._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      psVar4 = local_1e8;
      if (local_1e8 == (string *)0x0) goto LAB_0044de8c;
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p == &local_208.field_2) goto LAB_0044de8c;
    }
  }
  operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
LAB_0044de8c:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool linear_sRGB_to_linear_displayp3(const std::vector<float> &in_img, size_t width,
                         size_t height, size_t channels,
                         std::vector<float> *out_img, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if ((channels != 3) && (channels != 4)) {
    PUSH_ERROR_AND_RETURN(fmt::format("channels must be 3 or 4, but got {}", channels));
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }


  if (in_img.size() != (width * height * channels)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Input buffer size must be {}, but got {}", (width * height * channels), in_img.size()));
  }

  out_img->resize(in_img.size());

  // http://endavid.com/index.php?entry=79
  // https://tech.metail.com/introduction-colour-spaces-dci-p3/

  if (channels == 3) {
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b;
        r = in_img[3 * (y * width + x) + 0];
        g = in_img[3 * (y * width + x) + 1];
        b = in_img[3 * (y * width + x) + 2];

        float out_rgb[3];
        out_rgb[0] = 0.8225f * r + 0.1774f * g;
        out_rgb[1] = 0.0332f * r + 0.9669f * g;
        out_rgb[2] = 0.0171f * r + 0.0724f * g + 0.9108f * b;

        // clamp for just in case.
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[3 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[3 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[3 * (y * width + x) + 2] = out_rgb[2];
      }
    }

  } else { // rgba
    for (size_t y = 0; y < height; y++) {
      for (size_t x = 0; x < width; x++) {
        float r, g, b, a;
        r = in_img[4 * (y * width + x) + 0];
        g = in_img[4 * (y * width + x) + 1];
        b = in_img[4 * (y * width + x) + 2];
        a = in_img[4 * (y * width + x) + 3];

        float out_rgb[3];
        out_rgb[0] = 0.8225f * r + 0.1774f * g;
        out_rgb[1] = 0.0332f * r + 0.9669f * g;
        out_rgb[2] = 0.0171f * r + 0.0724f * g + 0.9108f * b;

        // clamp for just in case.
        out_rgb[0] = (out_rgb[0] < 0.0f) ? 0.0f : out_rgb[0];
        out_rgb[1] = (out_rgb[1] < 0.0f) ? 0.0f : out_rgb[1];
        out_rgb[2] = (out_rgb[2] < 0.0f) ? 0.0f : out_rgb[2];

        (*out_img)[4 * (y * width + x) + 0] = out_rgb[0];
        (*out_img)[4 * (y * width + x) + 1] = out_rgb[1];
        (*out_img)[4 * (y * width + x) + 2] = out_rgb[2];
        (*out_img)[4 * (y * width + x) + 3] = a;
      }
    }
  }

  return true;
}